

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWriteTruths(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  word *pTruth;
  char *pcVar5;
  long lVar6;
  Gia_Man_t *pGVar7;
  char *pcVar8;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar1 = false;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"rbh"), iVar3 == 0x62) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 == -1) break;
    if (iVar3 != 0x72) goto LAB_0028e5f4;
    bVar2 = (bool)(bVar2 ^ 1);
  }
  pGVar7 = pAbc->pGia;
  if (pGVar7 == (Gia_Man_t *)0x0) {
    Abc_Print(-1,"IoCommandWriteTruths(): There is no AIG.\n");
    return 1;
  }
  iVar3 = pGVar7->vCis->nSize - pGVar7->nRegs;
  if (iVar3 < 0x11) {
    if (2 < iVar3) {
      if (globalUtilOptind + 1 == argc) {
        pcVar5 = argv[globalUtilOptind];
        __stream = fopen(pcVar5,"wb");
        if (__stream == (FILE *)0x0) {
          printf("Cannot open file \"%s\" for writing.\n",pcVar5);
          return 0;
        }
        pGVar7 = pAbc->pGia;
        iVar4 = pGVar7->vCis->nSize - pGVar7->nRegs;
        iVar3 = 8 << ((char)iVar4 - 6U & 0x1f);
        if (iVar4 < 7) {
          iVar3 = 8;
        }
        lVar6 = 0;
        goto LAB_0028e562;
      }
LAB_0028e5f4:
      fwrite("usage: &write_truths [-rbh] <file>\n",0x23,1,(FILE *)pAbc->Err);
      fwrite("\t         writes truth tables of each PO of GIA manager into a file\n",0x44,1,
             (FILE *)pAbc->Err);
      pcVar8 = "yes";
      pcVar5 = "yes";
      if (!bVar2) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-r     : toggle reversing bits in the truth table [default = %s]\n",pcVar5);
      if (!bVar1) {
        pcVar8 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-b     : toggle using binary format [default = %s]\n",pcVar8);
      fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
      fwrite("\tfile   : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
      return 1;
    }
    pcVar5 = "IoCommandWriteTruths(): Can write truth tables for 3 inputs or more.\n";
  }
  else {
    pcVar5 = "IoCommandWriteTruths(): Can write truth tables up to 16 inputs.\n";
  }
  Abc_Print(-1,pcVar5);
  return 0;
LAB_0028e562:
  if (pGVar7->vCos->nSize <= lVar6) {
LAB_0028e6aa:
    fclose(__stream);
    return 0;
  }
  iVar4 = pGVar7->vCos->pArray[lVar6];
  if (((long)iVar4 < 0) || (pGVar7->nObjs <= iVar4)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (pGVar7->pObjs == (Gia_Obj_t *)0x0) goto LAB_0028e6aa;
  pTruth = Gia_ObjComputeTruthTable(pGVar7,pGVar7->pObjs + iVar4);
  if (bVar1) {
    fwrite(pTruth,(long)iVar3,1,__stream);
  }
  else {
    Extra_PrintHex((FILE *)__stream,(uint *)pTruth,pAbc->pGia->vCis->nSize - pAbc->pGia->nRegs);
    fputc(10,__stream);
  }
  lVar6 = lVar6 + 1;
  pGVar7 = pAbc->pGia;
  goto LAB_0028e562;
}

Assistant:

int IoCommandWriteTruths( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Gia_Obj_t * pObj;
    char * pFileName;
    FILE * pFile;
    word * pTruth;
    int nBytes;
    int fReverse = 0;
    int fBinary = 0;
    int c, i;
 
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rbh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'r':
                fReverse ^= 1;
                break;
            case 'b':
                fBinary ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "IoCommandWriteTruths(): There is no AIG.\n" );
        return 1;
    } 
    if ( Gia_ManPiNum(pAbc->pGia) > 16 )
    {
        Abc_Print( -1, "IoCommandWriteTruths(): Can write truth tables up to 16 inputs.\n" );
        return 0;
    }
    if ( Gia_ManPiNum(pAbc->pGia) < 3 )
    {
        Abc_Print( -1, "IoCommandWriteTruths(): Can write truth tables for 3 inputs or more.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // convert to logic
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return 0;
    }
    nBytes = 8 * Abc_Truth6WordNum( Gia_ManPiNum(pAbc->pGia) );
    Gia_ManForEachCo( pAbc->pGia, pObj, i )
    {
        pTruth = Gia_ObjComputeTruthTable( pAbc->pGia, pObj );
        if ( fBinary )
            fwrite( pTruth, nBytes, 1, pFile );
        else
            Extra_PrintHex( pFile, (unsigned *)pTruth, Gia_ManPiNum(pAbc->pGia) ), fprintf( pFile, "\n" );
    }
    fclose( pFile );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: &write_truths [-rbh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes truth tables of each PO of GIA manager into a file\n" );
    fprintf( pAbc->Err, "\t-r     : toggle reversing bits in the truth table [default = %s]\n", fReverse? "yes":"no" );
    fprintf( pAbc->Err, "\t-b     : toggle using binary format [default = %s]\n", fBinary? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}